

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O1

trt_type trop_resolve_type(lysp_node *pn)

{
  ushort uVar1;
  lysp_node *plVar2;
  undefined8 uVar3;
  lysp_node *plVar4;
  char *pcVar5;
  bool bVar6;
  trt_type tVar7;
  trt_type tVar8;
  
  if (pn == (lysp_node *)0x0) {
    uVar3 = 3;
    plVar4 = (lysp_node *)0x0;
    goto LAB_0019b4a7;
  }
  uVar1 = pn->nodetype;
  if ((uVar1 & 8) == 0) {
LAB_0019b4ba:
    plVar4 = (lysp_node *)0x0;
  }
  else {
    if (pn[2].parent == (lysp_node *)0x0) {
      plVar2 = (lysp_node *)0x0;
    }
    else {
      plVar2 = (lysp_node *)(pn[2].parent)->ref;
    }
    if (plVar2 == (lysp_node *)0x0) goto LAB_0019b4ba;
    plVar4 = (lysp_node *)0x0;
    if (*(char *)&plVar2->parent != '\0') {
      plVar4 = plVar2;
    }
  }
  uVar3 = 1;
  if (plVar4 != (lysp_node *)0x0) goto LAB_0019b4a7;
  uVar3 = 0;
  if (((uVar1 & 8) == 0) || (plVar2 = pn[1].next, plVar2 == (lysp_node *)0x0)) {
    plVar4 = (lysp_node *)0x0;
  }
  else {
    plVar4 = (lysp_node *)0x0;
    if (*(char *)&plVar2->parent != '\0') {
      plVar4 = plVar2;
    }
  }
  if (plVar4 != (lysp_node *)0x0) goto LAB_0019b4a7;
  if ((uVar1 & 4) == 0) {
LAB_0019b511:
    plVar4 = (lysp_node *)0x0;
  }
  else {
    if (pn[2].parent == (lysp_node *)0x0) {
      plVar2 = (lysp_node *)0x0;
    }
    else {
      plVar2 = (lysp_node *)(pn[2].parent)->ref;
    }
    if (plVar2 == (lysp_node *)0x0) goto LAB_0019b511;
    plVar4 = (lysp_node *)0x0;
    if (*(char *)&plVar2->parent != '\0') {
      plVar4 = plVar2;
    }
  }
  uVar3 = 1;
  if (plVar4 == (lysp_node *)0x0) {
    uVar3 = 0;
    if (((uVar1 & 4) == 0) || (plVar2 = pn[1].next, plVar2 == (lysp_node *)0x0)) {
      plVar4 = (lysp_node *)0x0;
    }
    else {
      plVar4 = (lysp_node *)0x0;
      if (*(char *)&plVar2->parent != '\0') {
        plVar4 = plVar2;
      }
    }
    if (plVar4 == (lysp_node *)0x0) {
      if (uVar1 != 0x60) {
        pcVar5 = (char *)0x0;
        bVar6 = (uVar1 & 0x20) == 0;
        tVar8._4_4_ = 0;
        tVar8.type = (uint)bVar6 * 3;
        if (!bVar6) {
          pcVar5 = "anyxml";
        }
        tVar8.str = pcVar5;
        return tVar8;
      }
      return (trt_type)(ZEXT816(0x1d8ae0) << 0x40);
    }
  }
LAB_0019b4a7:
  tVar7.str = (char *)plVar4;
  tVar7._0_8_ = uVar3;
  return tVar7;
}

Assistant:

static struct trt_type
trop_resolve_type(const struct lysp_node *pn)
{
    const char *tmp = NULL;

    if (!pn) {
        return TRP_EMPTY_TRT_TYPE;
    } else if ((tmp = trop_node_charptr(LYS_LEAFLIST, trop_leaflist_refpath, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_TARGET, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAFLIST, trop_leaflist_type_name, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAF, trop_leaf_refpath, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_TARGET, tmp);
    } else if ((tmp = trop_node_charptr(LYS_LEAF, trop_leaf_type_name, pn))) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, tmp);
    } else if (pn->nodetype == LYS_ANYDATA) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, "anydata");
    } else if (pn->nodetype & LYS_ANYXML) {
        return TRP_INIT_TRT_TYPE(TRD_TYPE_NAME, "anyxml");
    } else {
        return TRP_EMPTY_TRT_TYPE;
    }
}